

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionTxOut::DecodeRawTransactionTxOut
          (DecodeRawTransactionTxOut *this)

{
  JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut> *in_RDI;
  DecodeLockingScript *in_stack_00000020;
  
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodeRawTransactionTxOut_009f8070;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x64c875);
  in_RDI[7]._vptr_JsonClassBase = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[8]._vptr_JsonClassBase = 0;
  DecodeLockingScript::DecodeLockingScript(in_stack_00000020);
  CollectFieldName();
  return;
}

Assistant:

DecodeRawTransactionTxOut() {
    CollectFieldName();
  }